

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O2

int ppc_hash64_handle_mmu_fault(PowerPCCPU_conflict3 *cpu,vaddr eaddr,int rwx,int mmu_idx)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  ppc_slb_t *slb;
  hwaddr hVar5;
  hwaddr hVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint64_t uVar12;
  uint uVar13;
  uint *puVar14;
  target_ulong size;
  uint prot;
  uint apshift;
  long local_68;
  hwaddr local_60;
  ppc_hash_pte64_t pte;
  ppc_slb_t vrma_slbe;
  
  if (2 < (uint)rwx) {
    __assert_fail("(rwx == 0) || (rwx == 1) || (rwx == 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                  ,0x389,"int ppc_hash64_handle_mmu_fault(PowerPCCPU *, vaddr, int, int)");
  }
  uVar2 = (cpu->env).msr;
  if (rwx != 2) {
    if ((uVar2 & 0x10) == 0) goto LAB_009e0b62;
LAB_009e0ab1:
    slb = slb_lookup(cpu,eaddr);
    if (slb == (ppc_slb_t *)0x0) {
      if ((*(byte *)((long)(cpu->env).spr + 0x9f2) & 0x40) != 0) {
        fwrite("Segment Table Support Unimplemented",0x23,1,_stderr);
        exit(1);
      }
      if (rwx != 2) {
        (cpu->parent_obj).exception_index = 0x41;
        (cpu->env).error_code = 0;
        (cpu->env).spr[0x13] = eaddr;
        return 1;
      }
      (cpu->parent_obj).exception_index = 0x42;
      goto LAB_009e0c7e;
    }
LAB_009e0ac8:
    if ((rwx == 2) && ((slb->vsid & 0x200) != 0)) {
      uVar12 = 0x10000000;
      goto LAB_009e0d8c;
    }
    hVar5 = ppc_hash64_htab_lookup(cpu,slb,eaddr,&pte,&apshift);
    if (hVar5 == 0xffffffffffffffff) {
      if (rwx == 2) {
        uVar12 = 0x40000000;
        goto LAB_009e0d8c;
      }
      uVar12 = (ulong)((uint)(rwx == 1) << 0x19) | 0x40000000;
      goto LAB_009e0e56;
    }
    uVar8 = (uint)pte.pte1;
    iVar10 = (uVar8 & 3) + (int)((long)pte.pte1 >> 0x3f) * -4;
    if (((uint)slb->vsid & (uint)(((cpu->env).msr & 0x4000) == 0) * 0x400 + 0x400) == 0) {
      if (iVar10 == 7) goto LAB_009e0c8f;
      uVar4 = *(uint *)(&DAT_00bc1530 + (uint)(iVar10 * 4));
      puVar14 = (uint *)(&DAT_00bc154c + (uint)(iVar10 * 4));
LAB_009e0cc9:
      uVar11 = *puVar14;
    }
    else {
      if (iVar10 - 1U < 3) {
        puVar14 = (uint *)(&DAT_00bc1568 + (ulong)(iVar10 - 1U) * 4);
        uVar4 = 0;
        goto LAB_009e0cc9;
      }
LAB_009e0c8f:
      uVar11 = 0;
      uVar4 = 0x8000000;
    }
    if ((cpu->hash64_opts->flags & 2) == 0) {
      uVar13 = 7;
    }
    else {
      bVar3 = (byte)(pte.pte1 >> 9) & 7 | (byte)(pte.pte1 >> 0x39) & 0x18;
      uVar13 = (uint)((cpu->env).spr[0x1d] >> (bVar3 * '\x02' ^ 0x3e)) & 3;
      if (((cpu->env).mmu_model & ~POWERPC_MMU_32B) == POWERPC_MMU_2_07) {
        uVar13 = (uint)(((cpu->env).spr[0x3d] >> ((ulong)(byte)(bVar3 * -2 + 0x3e) & 0x3f) & 1) == 0
                       ) * 4 + 3 ^ uVar13;
      }
      else {
        uVar13 = uVar13 ^ 7;
      }
    }
    prot = (uint)((pte.pte1 & 0xc) == 0) * 4 + 3 & uVar11 & uVar13;
    uVar1 = *(uint *)(&DAT_00bc1010 + (ulong)(uint)rwx * 4);
    uVar12 = (uint64_t)uVar1;
    if ((uVar1 & ~prot) != 0) {
      if (rwx != 2) {
        uVar4 = (uint)((uVar1 & ~uVar11) != 0) * 0x8000000;
        uVar8 = uVar4 + 0x2000000;
        if (rwx != 1) {
          uVar8 = uVar4;
        }
        uVar12 = (uint64_t)(uVar8 + 0x200000);
        if ((uVar1 & ~uVar13) == 0) {
          uVar12 = (uint64_t)uVar8;
        }
LAB_009e0e56:
        ppc_hash64_set_dsi(&cpu->parent_obj,eaddr,uVar12);
        return 1;
      }
      uVar8 = 0x10000000;
      if ((pte.pte1 & 0xc) == 0) {
        uVar8 = uVar4;
      }
      uVar12 = (uint64_t)(((uVar13 & 0xfffffffc) << 0x13 | uVar8) ^ 0x200000);
LAB_009e0d8c:
      ppc_hash64_set_isi(&cpu->parent_obj,uVar12);
      return 1;
    }
    if ((uVar8 >> 8 & 1) == 0) {
      local_68 = hVar5 << 4;
      local_60 = hVar5;
      hVar5 = ppc_hash64_hpt_base(cpu);
      uVar4 = (uint)(pte.pte1 >> 8) & 0xff | 1;
      uVar12 = (uint64_t)uVar4;
      stb_phys_ppc64((cpu->env).uc,(cpu->parent_obj).as,local_68 + hVar5 + 0x10,uVar4);
      hVar5 = local_60;
    }
    if (-1 < (char)pte.pte1) {
      if (rwx == 1) {
        hVar6 = ppc_hash64_hpt_base(cpu);
        uVar8 = uVar8 & 0xff | 0x80;
        uVar12 = (uint64_t)uVar8;
        stb_phys_ppc64((cpu->env).uc,(cpu->parent_obj).as,hVar6 + hVar5 * 0x10 + 0xf,uVar8);
      }
      else {
        prot = prot & 0xfffffffd;
      }
    }
    uVar7 = deposit64(pte.pte1 & 0xffffffffffff000,apshift,(int)eaddr,uVar12);
    size = 1L << ((byte)apshift & 0x3f);
    goto LAB_009e0bf7;
  }
  if ((uVar2 & 0x20) != 0) goto LAB_009e0ab1;
LAB_009e0b62:
  uVar7 = eaddr & 0xfffffffffffffff;
  if (((uVar2 & 0x1000000000000000) == 0) && ((cpu->env).has_hv_mode != false)) {
    if (((cpu->env).mmu_model == POWERPC_MMU_3_00) ||
       (uVar2 = (cpu->env).spr[0x13e], (long)uVar2 < 0)) {
      slb = &vrma_slbe;
      iVar10 = build_vrma_slbe(cpu,slb);
      if (iVar10 != 0) {
        (cpu->parent_obj).exception_index = 1;
LAB_009e0c7e:
        (cpu->env).error_code = 0;
        return 1;
      }
      goto LAB_009e0ac8;
    }
    lVar9 = 0xb298;
    if (*(ulong *)(rmls_limit_rma_sizes + ((uint)(uVar2 >> 0x17) & 0x78)) <= uVar7) {
      if (rwx != 2) {
        uVar12 = (ulong)((uint)(rwx == 1) << 0x19) | 0x8000000;
        goto LAB_009e0e56;
      }
      uVar12 = 0x8000000;
      goto LAB_009e0d8c;
    }
LAB_009e0bd7:
    uVar7 = uVar7 | *(ulong *)((long)(cpu->parent_obj).jmp_env[0].__jmpbuf + lVar9 + -0x40);
  }
  else {
    lVar9 = 0xb2a0;
    if (-1 < (long)eaddr) goto LAB_009e0bd7;
  }
  prot = 7;
  size = 0x1000;
LAB_009e0bf7:
  tlb_set_page_ppc64(&cpu->parent_obj,eaddr & 0xfffffffffffff000,uVar7 & 0xfffffffffffff000,prot,
                     mmu_idx,size);
  return 0;
}

Assistant:

int ppc_hash64_handle_mmu_fault(PowerPCCPU *cpu, vaddr eaddr,
                                int rwx, int mmu_idx)
{
    CPUState *cs = CPU(cpu);
    CPUPPCState *env = &cpu->env;
    ppc_slb_t vrma_slbe;
    ppc_slb_t *slb;
    unsigned apshift;
    hwaddr ptex;
    ppc_hash_pte64_t pte;
    int exec_prot, pp_prot, amr_prot, prot;
    const int need_prot[] = {PAGE_READ, PAGE_WRITE, PAGE_EXEC};
    hwaddr raddr;

    assert((rwx == 0) || (rwx == 1) || (rwx == 2));

    /*
     * Note on LPCR usage: 970 uses HID4, but our special variant of
     * store_spr copies relevant fields into env->spr[SPR_LPCR].
     * Similarily we filter unimplemented bits when storing into LPCR
     * depending on the MMU version. This code can thus just use the
     * LPCR "as-is".
     */

    /* 1. Handle real mode accesses */
    if (((rwx == 2) && (msr_ir == 0)) || ((rwx != 2) && (msr_dr == 0))) {
        /*
         * Translation is supposedly "off", but in real mode the top 4
         * effective address bits are (mostly) ignored
         */
        raddr = eaddr & 0x0FFFFFFFFFFFFFFFULL;

#if 0
        if (cpu->vhyp) {
            /*
             * In virtual hypervisor mode, there's nothing to do:
             *   EA == GPA == qemu guest address
             */
        } else
#endif
        if (msr_hv || !env->has_hv_mode) {
            /* In HV mode, add HRMOR if top EA bit is clear */
            if (!(eaddr >> 63)) {
                raddr |= env->spr[SPR_HRMOR];
            }
        } else if (ppc_hash64_use_vrma(env)) {
            /* Emulated VRMA mode */
            slb = &vrma_slbe;
            if (build_vrma_slbe(cpu, slb) != 0) {
                /* Invalid VRMA setup, machine check */
                cs->exception_index = POWERPC_EXCP_MCHECK;
                env->error_code = 0;
                return 1;
            }

            goto skip_slb_search;
        } else {
            target_ulong limit = rmls_limit(cpu);

            /* Emulated old-style RMO mode, bounds check against RMLS */
            if (raddr >= limit) {
                if (rwx == 2) {
                    ppc_hash64_set_isi(cs, SRR1_PROTFAULT);
                } else {
                    int dsisr = DSISR_PROTFAULT;
                    if (rwx == 1) {
                        dsisr |= DSISR_ISSTORE;
                    }
                    ppc_hash64_set_dsi(cs, eaddr, dsisr);
                }
                return 1;
            }

            raddr |= env->spr[SPR_RMOR];
        }
        tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                     PAGE_READ | PAGE_WRITE | PAGE_EXEC, mmu_idx,
                     TARGET_PAGE_SIZE);
        return 0;
    }

    /* 2. Translation is on, so look up the SLB */
    slb = slb_lookup(cpu, eaddr);
    if (!slb) {
        /* No entry found, check if in-memory segment tables are in use */
        if (ppc64_use_proc_tbl(cpu)) {
            /* TODO - Unsupported */
            fprintf(stderr, "Segment Table Support Unimplemented");
            exit(1);
        }
        /* Segment still not found, generate the appropriate interrupt */
        if (rwx == 2) {
            cs->exception_index = POWERPC_EXCP_ISEG;
            env->error_code = 0;
        } else {
            cs->exception_index = POWERPC_EXCP_DSEG;
            env->error_code = 0;
            env->spr[SPR_DAR] = eaddr;
        }
        return 1;
    }

skip_slb_search:

    /* 3. Check for segment level no-execute violation */
    if ((rwx == 2) && (slb->vsid & SLB_VSID_N)) {
        ppc_hash64_set_isi(cs, SRR1_NOEXEC_GUARD);
        return 1;
    }

    /* 4. Locate the PTE in the hash table */
    ptex = ppc_hash64_htab_lookup(cpu, slb, eaddr, &pte, &apshift);
    if (ptex == -1) {
        if (rwx == 2) {
            ppc_hash64_set_isi(cs, SRR1_NOPTE);
        } else {
            int dsisr = DSISR_NOPTE;
            if (rwx == 1) {
                dsisr |= DSISR_ISSTORE;
            }
            ppc_hash64_set_dsi(cs, eaddr, dsisr);
        }
        return 1;
    }
    qemu_log_mask(CPU_LOG_MMU,
                  "found PTE at index %08" HWADDR_PRIx "\n", ptex);

    /* 5. Check access permissions */

    exec_prot = ppc_hash64_pte_noexec_guard(cpu, pte);
    pp_prot = ppc_hash64_pte_prot(cpu, slb, pte);
    amr_prot = ppc_hash64_amr_prot(cpu, pte);
    prot = exec_prot & pp_prot & amr_prot;

    if ((need_prot[rwx] & ~prot) != 0) {
        /* Access right violation */
        qemu_log_mask(CPU_LOG_MMU, "PTE access rejected\n");
        if (rwx == 2) {
            int srr1 = 0;
            if (PAGE_EXEC & ~exec_prot) {
                srr1 |= SRR1_NOEXEC_GUARD; /* Access violates noexec or guard */
            } else if (PAGE_EXEC & ~pp_prot) {
                srr1 |= SRR1_PROTFAULT; /* Access violates access authority */
            }
            if (PAGE_EXEC & ~amr_prot) {
                srr1 |= SRR1_IAMR; /* Access violates virt pg class key prot */
            }
            ppc_hash64_set_isi(cs, srr1);
        } else {
            int dsisr = 0;
            if (need_prot[rwx] & ~pp_prot) {
                dsisr |= DSISR_PROTFAULT;
            }
            if (rwx == 1) {
                dsisr |= DSISR_ISSTORE;
            }
            if (need_prot[rwx] & ~amr_prot) {
                dsisr |= DSISR_AMR;
            }
            ppc_hash64_set_dsi(cs, eaddr, dsisr);
        }
        return 1;
    }

    qemu_log_mask(CPU_LOG_MMU, "PTE access granted !\n");

    /* 6. Update PTE referenced and changed bits if necessary */

    if (!(pte.pte1 & HPTE64_R_R)) {
        ppc_hash64_set_r(cpu, ptex, pte.pte1);
    }
    if (!(pte.pte1 & HPTE64_R_C)) {
        if (rwx == 1) {
            ppc_hash64_set_c(cpu, ptex, pte.pte1);
        } else {
            /*
             * Treat the page as read-only for now, so that a later write
             * will pass through this function again to set the C bit
             */
            prot &= ~PAGE_WRITE;
        }
    }

    /* 7. Determine the real address from the PTE */

    raddr = deposit64(pte.pte1 & HPTE64_R_RPN, 0, apshift, eaddr);

    tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                 prot, mmu_idx, 1ULL << apshift);

    return 0;
}